

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O0

bool dxil_spv::emit_wmma_load(Impl *impl)

{
  uint immediate;
  bool bVar1;
  Id type_id_00;
  Id arg;
  Builder *this;
  Value *pVVar2;
  LoggingCallback p_Var3;
  void *pvVar4;
  Value *stride;
  Operation *this_00;
  WMMAAccessChain WVar5;
  char local_2078 [8];
  char buffer_1 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_1;
  Operation *load;
  bool column_major;
  uint32_t local_1050;
  Id local_1044;
  Id IStack_1040;
  WMMAAccessChain chain;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  Id type_id;
  uint32_t type_immediate;
  Builder *builder;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  pVVar2 = LLVMBC::Instruction::getOperand
                     (&(impl->ags).backdoor_instructions[1]->super_Instruction,5);
  if (pVVar2 == (impl->ags).active_read_backdoor) {
    if ((impl->ags).instructions[0].phase == 0) {
      if ((impl->ags).instructions[1].phase == 1) {
        immediate = (impl->ags).instructions[1].immediate;
        type_id_00 = build_coopmat_type(impl,immediate);
        if (type_id_00 == 0) {
          p_Var3 = get_thread_log_callback();
          if (p_Var3 == (LoggingCallback)0x0) {
            fprintf(_stderr,"[ERROR]: Failed to create coopmat type.\n");
            fflush(_stderr);
          }
          else {
            snprintf((char *)&chain.stride_id,0x1000,"Failed to create coopmat type.\n");
            pvVar4 = get_thread_log_callback_userdata();
            (*p_Var3)(pvVar4,Error,(char *)&chain.stride_id);
          }
          impl_local._7_1_ = false;
        }
        else {
          pVVar2 = LLVMBC::Instruction::getOperand
                             (&(impl->ags).backdoor_instructions[0]->super_Instruction,5);
          stride = LLVMBC::Instruction::getOperand
                             (&(impl->ags).backdoor_instructions[0]->super_Instruction,6);
          WVar5 = build_wmma_access_chain(impl,pVVar2,stride);
          local_1050 = WVar5.alignment;
          chain.chain_id = local_1050;
          local_1044 = WVar5.chain_id;
          if (local_1044 == 0) {
            impl_local._7_1_ = false;
          }
          else {
            if ((impl->ags).active_uav_op == AtomicBinOp) {
              emit_subgroup_barrier(impl);
            }
            this_00 = Converter::Impl::allocate(impl,OpCooperativeMatrixLoadKHR,type_id_00);
            Operation::add_id(this_00,local_1044);
            arg = spv::Builder::makeUintConstant(this,(uint)((immediate >> 7 & 1) != 0),false);
            Operation::add_id(this_00,arg);
            IStack_1040 = WVar5.stride_id;
            Operation::add_id(this_00,IStack_1040);
            if (chain.chain_id != 0) {
              Operation::add_literal(this_00,2);
              Operation::add_literal(this_00,chain.chain_id);
            }
            Converter::Impl::add(impl,this_00,false);
            if ((impl->ags).active_uav_op == AtomicBinOp) {
              emit_subgroup_barrier(impl);
            }
            bVar1 = emit_wmma_return_values(impl,type_id_00,this_00->id,2);
            if (bVar1) {
              impl_local._7_1_ = true;
            }
            else {
              p_Var3 = get_thread_log_callback();
              if (p_Var3 == (LoggingCallback)0x0) {
                fprintf(_stderr,"[ERROR]: Failed to emit WMMA return values.\n");
                fflush(_stderr);
              }
              else {
                snprintf(local_2078,0x1000,"Failed to emit WMMA return values.\n");
                pvVar4 = get_thread_log_callback_userdata();
                (*p_Var3)(pvVar4,Error,local_2078);
              }
              impl_local._7_1_ = false;
            }
          }
        }
      }
      else {
        impl_local._7_1_ = false;
      }
    }
    else {
      impl_local._7_1_ = false;
    }
  }
  else {
    impl_local._7_1_ = false;
  }
  return impl_local._7_1_;
}

Assistant:

static bool emit_wmma_load(Converter::Impl &impl)
{
	auto &builder = impl.builder();

	// Sanity check that we're reading from the hooked read opcode.
	if (impl.ags.backdoor_instructions[1]->getOperand(5) != impl.ags.active_read_backdoor)
		return false;

	if (impl.ags.instructions[0].phase != 0)
		return false;
	if (impl.ags.instructions[1].phase != 1)
		return false;

	uint32_t type_immediate = impl.ags.instructions[1].immediate;
	spv::Id type_id = build_coopmat_type(impl, type_immediate);

	if (!type_id)
	{
		LOGE("Failed to create coopmat type.\n");
		return false;
	}

	auto chain = build_wmma_access_chain(impl, impl.ags.backdoor_instructions[0]->getOperand(5),
	                                     impl.ags.backdoor_instructions[0]->getOperand(6));

	if (chain.chain_id == 0)
		return false;

	bool column_major = ((type_immediate >> AmdExtD3DShaderIntrinsicsWaveMatrixModifier_LayoutFlagShift) &
	                     AmdExtD3DShaderIntrinsicsWaveMatrixModifier_LayoutFlagMask) != 0;

	// Workaround AGS omitting barriers.
	if (impl.ags.active_uav_op == DXIL::Op::AtomicBinOp)
		emit_subgroup_barrier(impl);

	auto *load = impl.allocate(spv::OpCooperativeMatrixLoadKHR, type_id);
	load->add_id(chain.chain_id);
	load->add_id(builder.makeUintConstant(
		column_major ? spv::CooperativeMatrixLayoutColumnMajorKHR : spv::CooperativeMatrixLayoutRowMajorKHR));
	load->add_id(chain.stride_id);

	if (chain.alignment)
	{
		load->add_literal(spv::MemoryAccessAlignedMask);
		load->add_literal(chain.alignment);
	}

	impl.add(load);

	// Workaround AGS omitting barriers.
	if (impl.ags.active_uav_op == DXIL::Op::AtomicBinOp)
		emit_subgroup_barrier(impl);

	if (!emit_wmma_return_values(impl, type_id, load->id, 2))
	{
		LOGE("Failed to emit WMMA return values.\n");
		return false;
	}

	return true;
}